

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O1

ChildOp * __thiscall xercesc_4_0::OpFactory::createQuestionOp(OpFactory *this,bool nonGreedy)

{
  BaseRefVectorOf<xercesc_4_0::Op> *this_00;
  XMLSize_t XVar1;
  ChildOp *this_01;
  undefined7 in_register_00000031;
  
  this_01 = (ChildOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  ChildOp::ChildOp(this_01,(int)CONCAT71(in_register_00000031,nonGreedy) + O_QUESTION,
                   this->fMemoryManager);
  this_00 = &this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>;
  BaseRefVectorOf<xercesc_4_0::Op>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (Op *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

ChildOp* OpFactory::createQuestionOp(bool nonGreedy) {

    ChildOp* tmpOp = new (fMemoryManager)  ChildOp(nonGreedy ? Op::O_NONGREEDYQUESTION :
                                             Op::O_QUESTION, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}